

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_ring_buffer.cc
# Opt level: O1

void __thiscall
webrtc::AudioRingBuffer::Write(AudioRingBuffer *this,float **data,size_t channels,size_t frames)

{
  string *result;
  int line;
  ulong uVar1;
  size_t written;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  FatalMessage local_1a8;
  
  local_1a8._0_8_ =
       (long)(this->buffers_).super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->buffers_).super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_1c0 = frames;
  local_1b8 = channels;
  if (local_1a8._0_8_ == channels) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,&local_1b8,"buffers_.size() == channels");
  }
  if (result != (string *)0x0) {
    line = 0x21;
LAB_00141cb2:
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_ring_buffer.cc"
               ,line,result);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  if (local_1b8 != 0) {
    uVar1 = 0;
    do {
      local_1b0 = WebRtc_WriteBuffer((this->buffers_).
                                     super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar1],data[uVar1],
                                     local_1c0);
      if (local_1b0 == local_1c0) {
        result = (string *)0x0;
      }
      else {
        result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                           (&local_1b0,&local_1c0,"written == frames");
      }
      if (result != (string *)0x0) {
        line = 0x24;
        goto LAB_00141cb2;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_1b8);
  }
  return;
}

Assistant:

void AudioRingBuffer::Write(const float* const* data, size_t channels,
                            size_t frames) {
  RTC_DCHECK_EQ(buffers_.size(), channels);
  for (size_t i = 0; i < channels; ++i) {
    const size_t written = WebRtc_WriteBuffer(buffers_[i], data[i], frames);
    RTC_CHECK_EQ(written, frames);
  }
}